

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

Emb_Man_t * Emb_ManStart(Gia_Man_t *pGia)

{
  uint uVar1;
  Emb_Obj_t *pObj;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int v;
  Emb_Man_t *pEVar7;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  uint *puVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Gia_Obj_t *pGVar10;
  int iVar11;
  ulong uVar12;
  int i;
  int local_7c;
  int nFanios;
  int nObjs;
  
  Emb_ManCreateRefsSpecial(pGia);
  Emb_ManTransformRefs(pGia,&nObjs,&nFanios);
  Gia_ManFillValue(pGia);
  pEVar7 = (Emb_Man_t *)calloc(1,0x68);
  pEVar7->pGia = pGia;
  pEVar7->nRegs = pGia->nRegs;
  p = Vec_IntAlloc(pGia->vCis->nSize);
  pEVar7->vCis = p;
  p_00 = Vec_IntAlloc(pGia->vCos->nSize);
  pEVar7->vCos = p_00;
  iVar3 = pGia->vCos->nSize;
  uVar1 = nObjs * 5 + (pGia->nRegs + nFanios + iVar3) * 2;
  pEVar7->nObjData = uVar1;
  puVar8 = (uint *)calloc((long)(int)uVar1,4);
  pEVar7->pObjData = (int *)puVar8;
  pGVar9 = pGia->pObjs;
  pGVar9->Value = 0;
  *puVar8 = *puVar8 & 0xf | iVar3 << 4;
  uVar2 = Gia_ObjRefNum(pGia,pGVar9);
  puVar8[1] = uVar2;
  iVar3 = uVar2 + (*puVar8 >> 4);
  pEVar7->nObjs = 1;
  iVar11 = 1;
  while( true ) {
    uVar2 = iVar3 + 5;
    if (pGia->vCis->nSize <= iVar11 + -1) break;
    pGVar9 = Gia_ManCi(pGia,iVar11 + -1);
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    pGVar9->Value = uVar2;
    Vec_IntPush(p,uVar2);
    puVar8[(ulong)uVar2 + 2] = uVar2;
    iVar3 = Gia_ObjIsRo(pGia,pGVar9);
    puVar8[uVar2] = puVar8[uVar2] & 0xf | iVar3 << 4;
    uVar4 = Gia_ObjRefNum(pGia,pGVar9);
    puVar8[(ulong)uVar2 + 1] = uVar4;
    uVar6 = puVar8[uVar2];
    puVar8[uVar2] = uVar6 | 1;
    iVar3 = uVar2 + uVar4 + (uVar6 >> 4);
    iVar11 = iVar11 + 1;
    pEVar7->nObjs = iVar11;
  }
  p_01 = Vec_IntAlloc(100);
  p_02 = Vec_IntAlloc(100);
  local_7c = 1;
  for (iVar3 = 0; iVar3 < pGia->nObjs; iVar3 = iVar3 + 1) {
    pGVar9 = Gia_ManObj(pGia,iVar3);
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    uVar6 = (uint)*(undefined8 *)pGVar9;
    if ((~uVar6 & 0x1fffffff) != 0 && -1 < (int)uVar6) {
      iVar5 = Gia_ObjRefNum(pGia,pGVar9);
      if ((uVar6 >> 0x1e & 1) == 0) {
        if (iVar5 != 0) {
          __assert_fail("Gia_ObjRefNum( pGia, pObj ) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                        ,0x222,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
        }
      }
      else {
        if (iVar5 < 1) {
          __assert_fail("Gia_ObjRefNum( pGia, pObj ) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                        ,0x225,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
        }
        Emb_ManCollectSuper(pGia,pGVar9,p_01,p_02);
        pGVar9->Value = uVar2;
        pObj = (Emb_Obj_t *)(puVar8 + uVar2);
        puVar8[(ulong)uVar2 + 2] = uVar2;
        iVar5 = p_01->nSize;
        puVar8[uVar2] = puVar8[uVar2] & 0xf | iVar5 << 4;
        uVar6 = Gia_ObjRefNum(pGia,pGVar9);
        puVar8[(ulong)uVar2 + 1] = uVar6;
        i = 0;
        if (iVar5 < 1) {
          iVar5 = i;
        }
        for (; iVar5 != i; i = i + 1) {
          v = Vec_IntEntry(p_01,i);
          pGVar9 = Gia_ManObj(pGia,v);
          if (pGVar9 == (Gia_Obj_t *)0x0) break;
          Emb_ObjAddFanin(pObj,(Emb_Obj_t *)(puVar8 + pGVar9->Value));
        }
        uVar2 = uVar2 + (*(uint *)pObj >> 4) + pObj->nFanouts + 5;
        local_7c = local_7c + 1;
        iVar11 = iVar11 + 1;
        pEVar7->nObjs = iVar11;
      }
    }
  }
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  for (iVar3 = 0; iVar3 < pGia->vCos->nSize; iVar3 = iVar3 + 1) {
    pGVar9 = Gia_ManCo(pGia,iVar3);
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    pGVar9->Value = uVar2;
    Vec_IntPush(p_00,uVar2);
    puVar8[(ulong)uVar2 + 2] = uVar2;
    puVar8[uVar2] = puVar8[uVar2] & 0xf | 0x10;
    iVar5 = Gia_ObjIsRi(pGia,pGVar9);
    puVar8[(ulong)uVar2 + 1] = iVar5 + 1;
    *(byte *)(puVar8 + uVar2) = (byte)puVar8[uVar2] | 2;
    Emb_ObjAddFanin((Emb_Obj_t *)(puVar8 + uVar2),
                    (Emb_Obj_t *)
                    (puVar8 + pGVar9[-(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff)].Value));
    uVar2 = puVar8[(ulong)uVar2 + 1] + (puVar8[uVar2] >> 4) + uVar2 + 5;
    pEVar7->nObjs = iVar11 + 1 + iVar3;
  }
  for (iVar5 = 0; iVar5 < pGia->nRegs; iVar5 = iVar5 + 1) {
    pGVar9 = Gia_ManCo(pGia,(pGia->vCos->nSize - pGia->nRegs) + iVar5);
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    pGVar10 = Gia_ManCi(pGia,(pGia->vCis->nSize - pGia->nRegs) + iVar5);
    if (pGVar10 == (Gia_Obj_t *)0x0) break;
    Emb_ObjAddFanin((Emb_Obj_t *)(puVar8 + pGVar10->Value),(Emb_Obj_t *)(puVar8 + pGVar9->Value));
  }
  Gia_ManCleanMark0(pGia);
  if ((local_7c - iVar11) + p->nSize + p_00->nSize != iVar3) {
    __assert_fail("nNodes == Emb_ManNodeNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                  ,0x250,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
  }
  if (nObjs - iVar11 != iVar3) {
    __assert_fail("nObjs == p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                  ,0x251,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
  }
  if (uVar2 != uVar1) {
    __assert_fail("hHandle == p->nObjData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                  ,0x252,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
  }
  for (iVar3 = 0; iVar3 < pGia->nObjs; iVar3 = iVar3 + 1) {
    pGVar9 = Gia_ManObj(pGia,iVar3);
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    uVar12 = (ulong)pGVar9->Value;
    if (uVar12 != 0xffffffff) {
      if ((puVar8[uVar12] >> 4 != puVar8[uVar12 + 3]) &&
         ((~*(ulong *)pGVar9 & 0x1fffffff1fffffff) != 0)) {
        __assert_fail("pObjLog->nFanins == pObjLog->iFanin || Gia_ObjIsConst0(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                      ,0x25b,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
      }
      if ((puVar8[uVar12 + 1] != puVar8[uVar12 + 4]) &&
         ((-1 < (int)(uint)*(undefined8 *)pGVar9 ||
          (((uint)*(undefined8 *)pGVar9 & 0x1fffffff) == 0x1fffffff)))) {
        __assert_fail("pObjLog->nFanouts == pObjLog->iFanout || Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                      ,0x25c,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
      }
      (puVar8 + uVar12 + 3)[0] = 0;
      (puVar8 + uVar12 + 3)[1] = 0;
    }
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  return pEVar7;
}

Assistant:

Emb_Man_t * Emb_ManStart( Gia_Man_t * pGia )
{
    Emb_Man_t * p;
    Emb_Obj_t * pObjLog, * pFanLog;
    Gia_Obj_t * pObj, * pObjRi, * pObjRo, * pFanin;
    Vec_Int_t * vSuper, * vVisit;
    int nObjs, nFanios, nNodes = 0;
    int i, k, hHandle = 0;
    // prepare the AIG
//    Gia_ManCreateRefs( pGia );
    Emb_ManCreateRefsSpecial( pGia );
    Emb_ManTransformRefs( pGia, &nObjs, &nFanios );
    Gia_ManFillValue( pGia );
    // create logic network
    p = ABC_CALLOC( Emb_Man_t, 1 );
    p->pGia  = pGia;
    p->nRegs = Gia_ManRegNum(pGia);
    p->vCis  = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCos  = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->nObjData = (sizeof(Emb_Obj_t) / 4) * nObjs + 2 * (nFanios + Gia_ManRegNum(pGia) + Gia_ManCoNum(pGia));
    p->pObjData = ABC_CALLOC( int, p->nObjData );
    // create constant node
    Gia_ManConst0(pGia)->Value = hHandle;
    pObjLog = Emb_ManObj( p, hHandle );
    pObjLog->hHandle  = hHandle;
    pObjLog->nFanins  = Gia_ManCoNum(pGia);  //0;
    pObjLog->nFanouts = Gia_ObjRefNum( pGia, Gia_ManConst0(pGia) );
    // count objects
    hHandle += Emb_ObjSize( pObjLog );
    nNodes++;
    p->nObjs++;
    // create the PIs
    Gia_ManForEachCi( pGia, pObj, i )
    {
        // create PI object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCis, hHandle );
        pObjLog = Emb_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = Gia_ObjIsRo( pGia, pObj );
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        pObjLog->fCi = 1;
        // count objects
        hHandle += Emb_ObjSize( pObjLog );
        p->nObjs++;
    }
    // create internal nodes
    vSuper = Vec_IntAlloc( 100 );
    vVisit = Vec_IntAlloc( 100 );
    Gia_ManForEachAnd( pGia, pObj, i )
    {
        if ( pObj->fMark0 == 0 )
        {
            assert( Gia_ObjRefNum( pGia, pObj ) == 0 );
            continue;
        }
        assert( Gia_ObjRefNum( pGia, pObj ) > 0 );
        Emb_ManCollectSuper( pGia, pObj, vSuper, vVisit );
        // create node object
        pObj->Value = hHandle;
        pObjLog = Emb_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = Vec_IntSize( vSuper );
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        // add fanins
        Gia_ManForEachObjVec( vSuper, pGia, pFanin, k )
        {
            pFanLog = Emb_ManObj( p, Gia_ObjValue(pFanin) ); 
            Emb_ObjAddFanin( pObjLog, pFanLog );
        }
        // count objects
        hHandle += Emb_ObjSize( pObjLog );
        nNodes++;
        p->nObjs++;
    }
    Vec_IntFree( vSuper );
    Vec_IntFree( vVisit );
    // create the POs
    Gia_ManForEachCo( pGia, pObj, i )
    {
        // create PO object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCos, hHandle );
        pObjLog = Emb_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 1;
        pObjLog->nFanouts = 1 + Gia_ObjIsRi( pGia, pObj );
        pObjLog->fCo = 1;
        // add fanins
        pFanLog = Emb_ManObj( p, Gia_ObjValue(Gia_ObjFanin0(pObj)) );
        Emb_ObjAddFanin( pObjLog, pFanLog );
        // count objects
        hHandle += Emb_ObjSize( pObjLog );
        p->nObjs++;
    }
    // connect registers
    Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, i )
        Emb_ObjAddFanin( Emb_ManObj(p,Gia_ObjValue(pObjRo)), Emb_ManObj(p,Gia_ObjValue(pObjRi)) );
    Gia_ManCleanMark0( pGia );
    assert( nNodes  == Emb_ManNodeNum(p) );
    assert( nObjs   == p->nObjs );
    assert( hHandle == p->nObjData );
    if ( hHandle != p->nObjData )
        printf( "Emb_ManStart(): Fatal error in internal representation.\n" );
    // make sure the fanin/fanout counters are correct
    Gia_ManForEachObj( pGia, pObj, i )
    {
        if ( !~Gia_ObjValue(pObj) )
            continue;
        pObjLog = Emb_ManObj( p, Gia_ObjValue(pObj) );
        assert( pObjLog->nFanins  == pObjLog->iFanin || Gia_ObjIsConst0(pObj) );
        assert( pObjLog->nFanouts == pObjLog->iFanout || Gia_ObjIsCo(pObj) );
        pObjLog->iFanin = pObjLog->iFanout = 0;
    }
    ABC_FREE( pGia->pRefs );
    return p;
}